

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

ReaderFor<DynamicCapability> *
capnp::DynamicValue::Reader::AsImpl<capnp::DynamicCapability,_(capnp::Kind)7>::apply
          (ReaderFor<DynamicCapability> *__return_storage_ptr__,Reader *reader)

{
  if (reader->type == CAPABILITY) {
    (*(code *)((reader->field_1).structValue.reader.segment)->arena[4]._vptr_Arena)
              (__return_storage_ptr__);
    (__return_storage_ptr__->schema).super_Schema.raw =
         (RawBrandedSchema *)(reader->field_1).listValue.reader.segment;
  }
  else {
    AsImpl<capnp::DynamicCapability,(capnp::Kind)7>::apply(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ReaderFor<DynamicCapability> DynamicValue::Reader::AsImpl<DynamicCapability>::apply(
    const Reader& reader) {
  KJ_REQUIRE(reader.type == CAPABILITY, "Value type mismatch.") {
    return DynamicCapability::Client();
  }
  return reader.capabilityValue;
}